

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O2

bool __thiscall opencollada::ArgumentParser::parseArguments(ArgumentParser *this)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  iterator iVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  MissingArgumentParameterException *this_00;
  MissingArgumentException *pMVar6;
  UnknowArgumentException *this_01;
  long lVar7;
  ulong index;
  ulong uVar8;
  pointer pAVar9;
  
  pAVar9 = (this->mNoSwitchArguments).
           super__Vector_base<opencollada::Argument,_std::allocator<opencollada::Argument>_>._M_impl
           .super__Vector_impl_data._M_start;
  p_Var1 = &(this->mArguments)._M_t._M_impl.super__Rb_tree_header;
  uVar8 = 1;
  do {
    while( true ) {
      pbVar2 = (this->mCommandLine).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->mCommandLine).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar8) {
        p_Var5 = (this->mArguments)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          if ((_Rb_tree_header *)p_Var5 == p_Var1) {
            pAVar9 = (this->mNoSwitchArguments).
                     super__Vector_base<opencollada::Argument,_std::allocator<opencollada::Argument>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            while( true ) {
              if (pAVar9 == (this->mNoSwitchArguments).
                            super__Vector_base<opencollada::Argument,_std::allocator<opencollada::Argument>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                return true;
              }
              if ((pAVar9->mRequired == true) && (pAVar9->mSet == false)) break;
              pAVar9 = pAVar9 + 1;
            }
            pMVar6 = (MissingArgumentException *)__cxa_allocate_exception(0x48);
            MissingArgumentException::MissingArgumentException(pMVar6,&pAVar9->mHint);
            __cxa_throw(pMVar6,&MissingArgumentException::typeinfo,
                        MissingArgumentException::~MissingArgumentException);
          }
          if ((*(char *)((long)&p_Var5[5]._M_left + 1) == '\x01') &&
             (*(char *)&p_Var5[5]._M_left == '\0')) break;
          p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5);
        }
        pMVar6 = (MissingArgumentException *)__cxa_allocate_exception(0x48);
        MissingArgumentException::MissingArgumentException(pMVar6,(string *)(p_Var5 + 1));
        __cxa_throw(pMVar6,&MissingArgumentException::typeinfo,
                    MissingArgumentException::~MissingArgumentException);
      }
      iVar3 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
                      *)this,pbVar2 + uVar8);
      if ((_Rb_tree_header *)iVar3._M_node != p_Var1) break;
      if (pAVar9 == (this->mNoSwitchArguments).
                    super__Vector_base<opencollada::Argument,_std::allocator<opencollada::Argument>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        this_01 = (UnknowArgumentException *)__cxa_allocate_exception(0x48);
        UnknowArgumentException::UnknowArgumentException
                  (this_01,(this->mCommandLine).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar8);
        __cxa_throw(this_01,&UnknowArgumentException::typeinfo,
                    UnknowArgumentException::~UnknowArgumentException);
      }
      ::std::__cxx11::string::_M_assign
                ((string *)
                 (pAVar9->mValues).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      pAVar9->mSet = true;
      pAVar9 = pAVar9 + 1;
      uVar8 = uVar8 + 1;
    }
    *(undefined1 *)&iVar3._M_node[5]._M_left = 1;
    index = 0;
    lVar7 = uVar8 * 0x20;
    while( true ) {
      uVar4 = (long)iVar3._M_node[2]._M_parent - *(long *)(iVar3._M_node + 2) >> 5;
      if (uVar4 <= index) break;
      pbVar2 = (this->mCommandLine).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->mCommandLine).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
          uVar8 + 1 + index) {
        this_00 = (MissingArgumentParameterException *)__cxa_allocate_exception(0x48);
        MissingArgumentParameterException::MissingArgumentParameterException
                  (this_00,(this->mCommandLine).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar8);
        __cxa_throw(this_00,&MissingArgumentParameterException::typeinfo,
                    MissingArgumentParameterException::~MissingArgumentParameterException);
      }
      Argument::setValue((Argument *)(iVar3._M_node + 2),
                         (string *)((long)&pbVar2[1]._M_dataplus._M_p + lVar7),index);
      index = index + 1;
      lVar7 = lVar7 + 0x20;
    }
    uVar8 = uVar8 + 1 + uVar4;
  } while( true );
}

Assistant:

bool ArgumentParser::parseArguments()
	{
		try
		{
			auto noSwitchArgumentIt = mNoSwitchArguments.begin();
			for (size_t arg = 1; arg < mCommandLine.size();)
			{
				auto it = mArguments.find(mCommandLine[arg]);
				if (it == mArguments.end())
				{
					if (noSwitchArgumentIt != mNoSwitchArguments.end())
					{
						Argument& argument = *noSwitchArgumentIt;
						argument.setValue(mCommandLine[arg]);
						argument.isSet(true);
						++noSwitchArgumentIt;
						++arg;
						continue;
					}

                    throw UnknowArgumentException(mCommandLine[arg]);
				}

				Argument & argument = it->second;
				argument.isSet(true);
				for (size_t subArg = 0; subArg < argument.getNumParameters(); ++subArg)
				{
					size_t index = arg + subArg + 1;
					if (index >= mCommandLine.size())
					{
                        throw MissingArgumentParameterException(mCommandLine[arg]);
					}
					argument.setValue(mCommandLine[index], subArg);
				}
				arg += 1 + argument.getNumParameters();
			}

			for (const auto & argument : mArguments)
			{
				if (argument.second.isRequired() && !argument.second.isSet())
				{
                    throw MissingArgumentException(argument.first);
				}
			}

			for (const auto & argument : mNoSwitchArguments)
			{
				if (argument.isRequired() && !argument.isSet())
				{
					throw MissingArgumentException(argument.getHint());
				}
			}
		}
		catch (exception& e)
		{
			mParseError = e.what();
			return false;
		}
		return true;
	}